

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tags.hpp
# Opt level: O1

void __thiscall Qentem::Tags::TagBit::Clear(TagBit *this)

{
  Array<Qentem::Tags::IfTagCase> *this_00;
  
  switch(this->type_) {
  case Variable:
  case RawVariable:
    this_00 = (Array<Qentem::Tags::IfTagCase> *)this->storage_;
    if (this_00 == (Array<Qentem::Tags::IfTagCase> *)0x0) goto LAB_00128642;
    break;
  case Math:
    this_00 = (Array<Qentem::Tags::IfTagCase> *)this->storage_;
    if (this_00 == (Array<Qentem::Tags::IfTagCase> *)0x0) goto LAB_00128642;
    goto LAB_00128620;
  case SuperVariable:
  case Loop:
    this_00 = (Array<Qentem::Tags::IfTagCase> *)this->storage_;
    if (this_00 == (Array<Qentem::Tags::IfTagCase> *)0x0) goto LAB_00128642;
    Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)this_00);
    break;
  case InLineIf:
    this_00 = (Array<Qentem::Tags::IfTagCase> *)this->storage_;
    if (this_00 == (Array<Qentem::Tags::IfTagCase> *)0x0) goto LAB_00128642;
    Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)(this_00 + 1));
LAB_00128620:
    Array<Qentem::QExpression>::~Array((Array<Qentem::QExpression> *)this_00);
    break;
  case If:
    this_00 = (Array<Qentem::Tags::IfTagCase> *)this->storage_;
    if (this_00 == (Array<Qentem::Tags::IfTagCase> *)0x0) goto LAB_00128642;
    Array<Qentem::Tags::IfTagCase>::~Array(this_00);
    break;
  default:
    return;
  }
  MemoryRecord::RemoveAllocation(this_00);
LAB_00128642:
  operator_delete(this_00);
  return;
}

Assistant:

inline TagType GetType() const noexcept {
        return type_;
    }